

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

unsigned_short * make_id2insn(insn_map *insns,uint size)

{
  unsigned_short *puVar1;
  unsigned_short *cache;
  unsigned_short i;
  unsigned_short max_id;
  uint size_local;
  insn_map *insns_local;
  
  puVar1 = (unsigned_short *)(*cs_mem_malloc)((long)(int)(insns[size - 1].id + 1) << 1);
  for (cache._0_2_ = 1; (ushort)cache < size; cache._0_2_ = (ushort)cache + 1) {
    puVar1[insns[(ushort)cache].id] = (ushort)cache;
  }
  return puVar1;
}

Assistant:

static unsigned short *make_id2insn(insn_map *insns, unsigned int size)
{
	// NOTE: assume that the max id is always put at the end of insns array
	unsigned short max_id = insns[size - 1].id;
	unsigned short i;

	unsigned short *cache = (unsigned short *)cs_mem_malloc(sizeof(*cache) * (max_id + 1));

	for (i = 1; i < size; i++)
		cache[insns[i].id] = i;

	return cache;
}